

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YamahaCommands.hpp
# Opt level: O0

void __thiscall TI::TMS::Commands::Line::advance(Line *this)

{
  CommandContext *pCVar1;
  Line *this_local;
  
  pCVar1 = (this->super_Command).context;
  (pCVar1->size).v[0] = (pCVar1->size).v[0] + -1;
  (this->super_Command).cycles = 0x58;
  if ((((this->super_Command).context)->arguments & 1) == 0) {
    Command::advance_axis<0,false>(&this->super_Command,1);
  }
  else {
    Command::advance_axis<1,false>(&this->super_Command,1);
  }
  this->position_ = this->position_ - this->numerator_;
  if (this->position_ < 0) {
    this->position_ = this->denominator_ + this->position_;
    (this->super_Command).cycles = (this->super_Command).cycles + 0x20;
    if ((((this->super_Command).context)->arguments & 1) == 0) {
      Command::advance_axis<1,false>(&this->super_Command,1);
    }
    else {
      Command::advance_axis<0,false>(&this->super_Command,1);
    }
  }
  return;
}

Assistant:

void advance() final {
			--context.size.v[0];
			cycles = 88;

			// b0:	1 => long direction is y;
			//		0 => long direction is x.
			//
			// b2:	1 => x direction is left;
			//		0 => x direction is right.
			//
			// b3:	1 => y direction is up;
			//		0 => y direction is down.
			if(context.arguments & 0x1) {
				advance_axis<1, false>();
			} else {
				advance_axis<0, false>();
			}

			position_ -= numerator_;
			if(position_ < 0) {
				position_ += denominator_;
				cycles += 32;

				if(context.arguments & 0x1) {
					advance_axis<0, false>();
				} else {
					advance_axis<1, false>();
				}
			}
		}